

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

int JS_SetObjectData(JSContext *ctx,JSValue obj,JSValue val)

{
  JSValue v;
  int iVar1;
  undefined8 in_RCX;
  int64_t in_RDX;
  JSValueUnion in_RSI;
  JSContext *in_RDI;
  undefined8 in_R8;
  JSObject *p;
  undefined4 in_stack_ffffffffffffffb0;
  uint in_stack_ffffffffffffffb4;
  JSValue in_stack_ffffffffffffffb8;
  
  if ((int)in_RDX == -1) {
    in_stack_ffffffffffffffb4 = (uint)*(ushort *)((long)in_RSI.ptr + 6);
    if ((in_stack_ffffffffffffffb4 - 4 < 4) || (in_stack_ffffffffffffffb4 == 10)) {
      JS_FreeValue((JSContext *)
                   (ulong)CONCAT24(*(ushort *)((long)in_RSI.ptr + 6),in_stack_ffffffffffffffb0),
                   in_stack_ffffffffffffffb8);
      *(undefined8 *)((long)in_RSI.ptr + 0x30) = in_RCX;
      *(undefined8 *)((long)in_RSI.ptr + 0x38) = in_R8;
      return 0;
    }
  }
  JS_FreeValue((JSContext *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
               in_stack_ffffffffffffffb8);
  v.tag = in_RDX;
  v.u.ptr = in_RSI.ptr;
  iVar1 = JS_IsException(v);
  if (iVar1 == 0) {
    JS_ThrowTypeError(in_RDI,"invalid object type");
  }
  return -1;
}

Assistant:

static int JS_SetObjectData(JSContext *ctx, JSValueConst obj, JSValue val)
{
    JSObject *p;

    if (JS_VALUE_GET_TAG(obj) == JS_TAG_OBJECT) {
        p = JS_VALUE_GET_OBJ(obj);
        switch(p->class_id) {
        case JS_CLASS_NUMBER:
        case JS_CLASS_STRING:
        case JS_CLASS_BOOLEAN:
        case JS_CLASS_SYMBOL:
        case JS_CLASS_DATE:
#ifdef CONFIG_BIGNUM
        case JS_CLASS_BIG_INT:
        case JS_CLASS_BIG_FLOAT:
        case JS_CLASS_BIG_DECIMAL:
#endif
            JS_FreeValue(ctx, p->u.object_data);
            p->u.object_data = val;
            return 0;
        }
    }
    JS_FreeValue(ctx, val);
    if (!JS_IsException(obj))
        JS_ThrowTypeError(ctx, "invalid object type");
    return -1;
}